

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O1

void __thiscall FileWriter::~FileWriter(FileWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 uVar4;
  
  (this->super_PacketWriter)._vptr_PacketWriter = (_func_int **)&PTR__FileWriter_0014a608;
  uVar4 = ___throw_bad_array_new_length;
  lVar3 = _VTT;
  *(long *)&this->of_ = _VTT;
  *(undefined8 *)(&this->of_ + *(long *)(lVar3 + -0x18)) = uVar4;
  std::filebuf::~filebuf((filebuf *)&this->field_0x50);
  std::ios_base::~ios_base((ios_base *)&this->field_0x140);
  pcVar2 = (this->currentFilename_)._M_dataplus._M_p;
  paVar1 = &(this->currentFilename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->pattern_)._M_dataplus._M_p;
  paVar1 = &(this->pattern_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  PacketWriter::~PacketWriter(&this->super_PacketWriter);
  return;
}

Assistant:

FileWriter::~FileWriter() {
}